

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cumulative.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  value_type vVar1;
  int iVar2;
  istream *piVar3;
  ostream *poVar4;
  char separator;
  double y;
  double x;
  ifstream file;
  byte abStack_270 [488];
  regression<double> filter;
  
  if (argc == 2) {
    filter.y_moment.super_basic_moment<double,_(trial::online::with)1>.member.mean = 0.0;
    filter.y_moment.super_basic_moment<double,_(trial::online::with)1>.member.count = 0;
    filter.x_moment.super_basic_moment<double,_(trial::online::with)1>.member.count = 0;
    filter.x_moment.sum.variance = 0.0;
    filter.co_moment.center = 0.0;
    filter.x_moment.super_basic_moment<double,_(trial::online::with)1>.member.mean = 0.0;
    filter.co_moment.y_center.member.mean = 0.0;
    filter.co_moment.y_center.member.count = 0;
    filter.co_moment.x_center.member.mean = 0.0;
    filter.co_moment.x_center.member.count = 0;
    filter.y_moment.sum.variance = 0.0;
    std::ifstream::ifstream(&file,argv[1],_S_in);
    while ((abStack_270[*(long *)(_file + -0x18)] & 5) == 0) {
      piVar3 = std::istream::_M_extract<double>((double *)&file);
      piVar3 = std::operator>>(piVar3,&separator);
      std::istream::_M_extract<double>((double *)piVar3);
      trial::online::cumulative::regression<double>::push(&filter,x,y);
      poVar4 = std::ostream::_M_insert<double>(x);
      std::operator<<(poVar4,',');
      poVar4 = std::ostream::_M_insert<double>(y);
      std::operator<<(poVar4,',');
      vVar1 = trial::online::cumulative::regression<double>::slope(&filter);
      poVar4 = std::ostream::_M_insert<double>(vVar1);
      std::operator<<(poVar4,',');
      vVar1 = trial::online::cumulative::regression<double>::at(&filter,0.0);
      poVar4 = std::ostream::_M_insert<double>(vVar1);
      std::operator<<(poVar4,'\n');
    }
    std::ifstream::~ifstream(&file);
    iVar2 = 0;
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar4 = std::operator<<(poVar4,*argv);
    poVar4 = std::operator<<(poVar4," <file>");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int main(int argc, const char *argv[])
{
    if (argc != 2)
    {
        std::cerr << "Usage: " << argv[0] << " <file>" << std::endl;
        return 1;
    }

    cumulative::regression<double> filter;

    double x;
    double y;
    char separator;

    std::ifstream file(argv[1]);
    while (file)
    {
        file >> x >> separator >> y;
        filter.push(x, y);
        std::cout << x << ',' << y << ',' << filter.slope() << ',' << filter.at(0) << '\n';
    }
    return 0;
}